

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall cmGhsMultiTargetGenerator::GenerateTarget(cmGhsMultiTargetGenerator *this)

{
  pointer pcVar1;
  string *psVar2;
  string *extraout_RDX;
  string language;
  string fproj;
  cmGeneratedFileStream fout;
  string local_2a0;
  string local_280;
  cmGeneratedFileStream local_260;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)&local_280);
  std::__cxx11::string::_M_append((char *)&local_280,(ulong)(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_280);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_260,&local_280,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&local_260,true);
  cmGlobalGhsMultiGenerator::WriteFileHeader
            ((cmGlobalGhsMultiGenerator *)
             (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,(ostream *)&local_260);
  GhsMultiGpj::WriteGpjTag(this->TagType,(ostream *)&local_260);
  if (this->TagType != CUSTOM_TARGET) {
    psVar2 = &this->ConfigName;
    cmGeneratorTarget::GetLinkerLanguage(&local_2a0,this->GeneratorTarget,psVar2);
    WriteTargetSpecifics(this,(ostream *)&local_260,psVar2);
    SetCompilerFlags(this,psVar2,&local_2a0);
    WriteCompilerFlags(this,(ostream *)&local_260,extraout_RDX,&local_2a0);
    WriteCompilerDefinitions(this,(ostream *)&local_260,psVar2,&local_2a0);
    WriteIncludes(this,(ostream *)&local_260,psVar2,&local_2a0);
    WriteTargetLinkLine(this,(ostream *)&local_260,psVar2);
    WriteBuildEvents(this,(ostream *)&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
  }
  WriteSources(this,(ostream *)&local_260);
  cmGeneratedFileStream::Close(&local_260);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::GenerateTarget()
{
  // Open the target file in copy-if-different mode.
  std::string fproj = this->LocalGenerator->GetCurrentBinaryDirectory();
  fproj += "/";
  fproj += this->Name;
  fproj += cmGlobalGhsMultiGenerator::FILE_EXTENSION;
  cmGeneratedFileStream fout(fproj);
  fout.SetCopyIfDifferent(true);

  this->GetGlobalGenerator()->WriteFileHeader(fout);
  GhsMultiGpj::WriteGpjTag(this->TagType, fout);

  if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
    const std::string language(
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName));
    this->WriteTargetSpecifics(fout, this->ConfigName);
    this->SetCompilerFlags(this->ConfigName, language);
    this->WriteCompilerFlags(fout, this->ConfigName, language);
    this->WriteCompilerDefinitions(fout, this->ConfigName, language);
    this->WriteIncludes(fout, this->ConfigName, language);
    this->WriteTargetLinkLine(fout, this->ConfigName);
    this->WriteBuildEvents(fout);
  }
  this->WriteSources(fout);
  fout.Close();
}